

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O1

Vec_Int_t * Sdb_StoIterCuts(Sdb_Sto_t *p)

{
  Vec_Int_t *pVVar1;
  void *__ptr;
  bool bVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar6;
  Gia_Man_t *pGVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int *pCut;
  uint local_60;
  uint local_5c;
  int *local_48;
  int local_3c;
  Vec_Int_t *local_38;
  
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pVVar6 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pArray = pVVar6;
  pGVar7 = p->pGia;
  if (0 < pGVar7->nObjs) {
    lVar10 = 0;
    do {
      if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
      uVar5 = *(uint *)(pGVar7->pObjs + lVar10);
      if (((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) &&
         (iVar4 = Sdb_StoIterCutsOne(p,(int)lVar10,5,&local_48), piVar3 = local_48, iVar4 != 0)) {
        if (iVar4 != 1) {
          __assert_fail("RetValue == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                        ,0x41f,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
        }
        if (*local_48 != 5) {
          __assert_fail("pCut[0] == 5",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                        ,0x420,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
        }
        pVVar6 = Vec_WecPushLevel(p_00);
        if (0 < *piVar3) {
          lVar8 = 0;
          do {
            Vec_IntPush(pVVar6,piVar3[lVar8 + 1]);
            lVar8 = lVar8 + 1;
          } while (lVar8 < *piVar3);
        }
      }
      lVar10 = lVar10 + 1;
      pGVar7 = p->pGia;
    } while (lVar10 < pGVar7->nObjs);
  }
  local_3c = p_00->nSize;
  printf("Detected %d  5-cuts.\n");
  pVVar6 = Sdb_StoFindAll(p_00);
  pGVar7 = p->pGia;
  if (pGVar7->nObjs < 1) {
    bVar2 = true;
    local_60 = 0xffffffff;
    local_5c = 0xffffffff;
  }
  else {
    bVar2 = false;
    local_5c = 0xffffffff;
    lVar10 = 0;
    local_60 = 0xffffffff;
    local_38 = pVVar6;
    do {
      if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
      uVar5 = *(uint *)(pGVar7->pObjs + lVar10);
      if (((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) &&
         (iVar4 = Sdb_StoIterCutsOne(p,(int)lVar10,4,&local_48), piVar3 = local_48, iVar4 != 0)) {
        if (iVar4 == 1) {
          __assert_fail("RetValue >= 2 && RetValue <= 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                        ,0x42d,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
        }
        if (*local_48 != 4) {
          __assert_fail("pCut[0] == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                        ,0x42e,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
        }
        uVar5 = Sdb_StoDiffExactlyOne(p_00,local_3c,local_48);
        if (uVar5 != 0xffffffff) {
          if (iVar4 != 2) {
            local_5c = uVar5;
            uVar5 = local_60;
          }
          local_60 = uVar5;
          if (iVar4 == 4) {
            bVar2 = true;
          }
          pVVar6 = Vec_WecPushLevel(p_00);
          Vec_IntPush(pVVar6,0);
          if (0 < *piVar3) {
            lVar8 = 0;
            do {
              Vec_IntPush(pVVar6,piVar3[lVar8 + 1]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < *piVar3);
          }
        }
      }
      lVar10 = lVar10 + 1;
      pGVar7 = p->pGia;
    } while (lVar10 < pGVar7->nObjs);
    bVar2 = !bVar2;
    pVVar6 = local_38;
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  if (pVVar6 != (Vec_Int_t *)0x0) {
    free(pVVar6);
  }
  iVar4 = p_00->nSize;
  if (0 < (long)iVar4) {
    pVVar6 = p_00->pArray;
    uVar9 = 0;
    do {
      printf(" %4d : {",uVar9 & 0xffffffff);
      if (0 < pVVar6[uVar9].nSize) {
        lVar10 = 0;
        do {
          printf(" %d",(ulong)(uint)pVVar6[uVar9].pArray[lVar10]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar6[uVar9].nSize);
      }
      puts(" }");
      uVar9 = uVar9 + 1;
    } while (uVar9 != (long)iVar4);
  }
  if (local_60 != 0) {
    printf("Front  = %d\n",(ulong)local_60);
  }
  if (local_5c != 0) {
    printf("Back   = %d\n");
  }
  if (!bVar2) {
    printf("Sign   = %d\n",1);
  }
  pVVar6 = Sdb_StoFindInputs(p_00,local_60);
  iVar4 = p_00->nCap;
  if (0 < (long)iVar4) {
    pVVar1 = p_00->pArray;
    lVar10 = 0;
    do {
      __ptr = *(void **)((long)&pVVar1->pArray + lVar10);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar1->pArray + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar4 * 0x10 != lVar10);
  }
  if (p_00->pArray != (Vec_Int_t *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (Vec_Int_t *)0x0;
  }
  p_00->nCap = 0;
  p_00->nSize = 0;
  free(p_00);
  return pVVar6;
}

Assistant:

Vec_Int_t * Sdb_StoIterCuts( Sdb_Sto_t * p )
{
    Vec_Wec_t * v5Cuts = Vec_WecAlloc( 100 );
    Vec_Int_t * v5Cut, * vAll, * vRes;
    Gia_Obj_t * pObj;   
    int k, iObj, * pCut, Limit, iNew, iNewFront = -1, iNewBack = -1, iSigned = 0;
    Gia_ManForEachAnd( p->pGia, pObj, iObj )
    {
        int RetValue = Sdb_StoIterCutsOne( p, iObj, 5, &pCut );
        if ( RetValue == 0 )
            continue;
        assert( RetValue == 1 );
        assert( pCut[0] == 5 );
        v5Cut = Vec_WecPushLevel( v5Cuts );
        for ( k = 1; k <= pCut[0]; k++ )
            Vec_IntPush( v5Cut, pCut[k] );
    }
    Limit = Vec_WecSize( v5Cuts );
    printf( "Detected %d  5-cuts.\n", Vec_WecSize(v5Cuts) );
    vAll = Sdb_StoFindAll( v5Cuts );
    Gia_ManForEachAnd( p->pGia, pObj, iObj )
    {
        int RetValue = Sdb_StoIterCutsOne( p, iObj, 4, &pCut );
        if ( RetValue == 0 )
            continue;
        assert( RetValue >= 2 && RetValue <= 4 );
        assert( pCut[0] == 4 );
        // find cut, which differs in exactly one input
        iNew = Sdb_StoDiffExactlyOne( v5Cuts, Limit, pCut );
        if ( iNew == -1 )
            continue;
        if ( RetValue == 2 )
            iNewFront = iNew;
        else 
            iNewBack = iNew;
        if ( RetValue == 4 )
            iSigned = 1;
        // save in the second cut
        v5Cut = Vec_WecPushLevel( v5Cuts );
        Vec_IntPush( v5Cut, 0 );
        for ( k = 1; k <= pCut[0]; k++ )
            Vec_IntPush( v5Cut, pCut[k] );
    }
    Vec_IntFree( vAll );
    Vec_WecPrint( v5Cuts, 0 );

    if ( iNewFront )
        printf( "Front  = %d\n", iNewFront );
    if ( iNewBack )
        printf( "Back   = %d\n", iNewBack );
    if ( iSigned )
        printf( "Sign   = %d\n", iSigned );

    vRes = Sdb_StoFindInputs( v5Cuts, iNewFront );

    Vec_WecFree( v5Cuts );
    return vRes;
}